

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsApp.cpp
# Opt level: O2

void __thiscall
helics::apps::App::loadJsonFile
          (App *this,string *jsonString,bool enableFederateInterfaceRegistration)

{
  allocator<char> local_41;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"application",&local_41);
  loadJsonFileConfiguration(this,&local_40,jsonString,enableFederateInterfaceRegistration);
  std::__cxx11::string::~string((string *)&local_40);
  return;
}

Assistant:

void App::loadJsonFile(const std::string& jsonString, bool enableFederateInterfaceRegistration)
{
    loadJsonFileConfiguration("application", jsonString, enableFederateInterfaceRegistration);
}